

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O1

void Imf_3_2::anon_unknown_7::writePixelData
               (OutputStreamMutex *filedata,Data *partdata,int lineBufferMinY,char *pixelData,
               uint64_t packedDataSize,uint64_t unpackedDataSize,char *sampleCountTableData,
               uint64_t sampleCountTableSize)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  uint64_t local_48;
  uint64_t local_40;
  char *local_38;
  unsigned_long uVar3;
  
  uVar3 = filedata->currentPosition;
  filedata->currentPosition = 0;
  local_40 = unpackedDataSize;
  local_38 = pixelData;
  if (uVar3 == 0) {
    iVar2 = (*filedata->os->_vptr_OStream[3])();
    uVar3 = CONCAT44(extraout_var,iVar2);
  }
  (partdata->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start
  [(partdata->currentScanLine - partdata->minY) / partdata->linesInBuffer] = uVar3;
  if (partdata->multipart == true) {
    local_48 = CONCAT44(local_48._4_4_,partdata->partNumber);
    (*filedata->os->_vptr_OStream[2])(filedata->os,&local_48,4);
  }
  local_48 = CONCAT44(local_48._4_4_,lineBufferMinY);
  (*filedata->os->_vptr_OStream[2])(filedata->os,&local_48,4);
  local_48 = sampleCountTableSize;
  (*filedata->os->_vptr_OStream[2])(filedata->os,&local_48,8);
  local_48 = packedDataSize;
  (*filedata->os->_vptr_OStream[2])(filedata->os,&local_48,8);
  local_48 = local_40;
  (*filedata->os->_vptr_OStream[2])(filedata->os,&local_48,8);
  (*filedata->os->_vptr_OStream[2])
            (filedata->os,sampleCountTableData,sampleCountTableSize & 0xffffffff);
  (*filedata->os->_vptr_OStream[2])(filedata->os,local_38,packedDataSize & 0xffffffff);
  lVar1 = packedDataSize + sampleCountTableSize + uVar3;
  filedata->currentPosition = lVar1 + 0x1c;
  if (partdata->multipart == true) {
    filedata->currentPosition = lVar1 + 0x20;
  }
  return;
}

Assistant:

void
writePixelData (
    OutputStreamMutex*            filedata,
    DeepScanLineOutputFile::Data* partdata,
    int                           lineBufferMinY,
    const char                    pixelData[],
    uint64_t                      packedDataSize,
    uint64_t                      unpackedDataSize,
    const char                    sampleCountTableData[],
    uint64_t                      sampleCountTableSize)
{
    //
    // Store a block of pixel data in the output file, and try
    // to keep track of the current writing position the file
    // without calling tellp() (tellp() can be fairly expensive).
    //

    uint64_t currentPosition  = filedata->currentPosition;
    filedata->currentPosition = 0;

    if (currentPosition == 0) currentPosition = filedata->os->tellp ();

    partdata->lineOffsets
        [(partdata->currentScanLine - partdata->minY) /
         partdata->linesInBuffer] = currentPosition;

#ifdef DEBUG

    assert (filedata->os->tellp () == currentPosition);

#endif

    //
    // Write the optional part number.
    //

    if (partdata->multipart)
    {
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
            *filedata->os, partdata->partNumber);
    }

    //
    // Write the y coordinate of the first scanline in the chunk.
    //

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *filedata->os, lineBufferMinY);

    //
    // Write the packed size of the pixel sample count table.
    //

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *filedata->os, sampleCountTableSize);

    //
    // Write the packed pixel data size.
    //

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *filedata->os, packedDataSize);

    //
    // Write the unpacked pixel data size.
    //

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *filedata->os, unpackedDataSize);

    //
    // Write the packed pixel sample count table.
    //

    filedata->os->write (
        sampleCountTableData, static_cast<int> (sampleCountTableSize));

    //
    // Write the compressed data.
    //

    filedata->os->write (pixelData, static_cast<int> (packedDataSize));

    //
    // Update stream position.
    //

    filedata->currentPosition =
        currentPosition + Xdr::size<int> () + // y coordinate
        Xdr::size<uint64_t> () +              // packed sample count table size
        Xdr::size<uint64_t> () +              // packed data size
        Xdr::size<uint64_t> () +              // unpacked data size
        sampleCountTableSize +                // pixel sample count table
        packedDataSize;                       // pixel data

    if (partdata->multipart)
    {
        filedata->currentPosition += Xdr::size<int> (); // optional part number
    }
}